

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
ConfigurationTestNode::Evaluate
          (string *__return_storage_ptr__,ConfigurationTestNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *desired_config;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  cmValue s;
  char *__s;
  pointer pbVar4;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string suffix;
  string mapProp;
  cmValue imp;
  cmValue loc;
  cmAlphaNum local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  cmValue local_70;
  cmValue local_68;
  cmAlphaNum local_60;
  
  if ((parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    context->HadContextSensitiveCondition = true;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&context->Config);
  }
  else {
    if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
         ::configValidator == '\0') &&
       (iVar3 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                     ::configValidator), iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression(&Evaluate::configValidator,"^[A-Za-z0-9_]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::configValidator,
                   &__dso_handle);
      __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                           ::configValidator);
    }
    bVar2 = cmsys::RegularExpression::find
                      (&Evaluate::configValidator,
                       (parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (bVar2) {
      context->HadContextSensitiveCondition = true;
      pbVar1 = (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      desired_config = &context->Config;
      for (pbVar4 = (parameters->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1;
          pbVar4 = pbVar4 + 1) {
        if ((context->Config)._M_string_length == 0) {
          if (pbVar4->_M_string_length == 0) goto LAB_00470feb;
        }
        else {
          iVar3 = cmsysString_strcasecmp
                            ((pbVar4->_M_dataplus)._M_p,(desired_config->_M_dataplus)._M_p);
          if (iVar3 == 0) {
LAB_00470feb:
            __s = "1";
            goto LAB_0047101c;
          }
        }
      }
      if ((context->CurrentTarget != (cmGeneratorTarget *)0x0) &&
         (bVar2 = cmGeneratorTarget::IsImported(context->CurrentTarget), bVar2)) {
        local_68.Value = (string *)0x0;
        local_70.Value = (string *)0x0;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        bVar2 = cmTarget::GetMappedConfig
                          (context->CurrentTarget->Target,desired_config,&local_68,&local_70,
                           &local_d0);
        if (bVar2) {
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_118.View_._M_len = 0x14;
          local_118.View_._M_str = "MAP_IMPORTED_CONFIG_";
          cmsys::SystemTools::UpperCase(&local_b0,desired_config);
          local_60.View_._M_len = local_b0._M_string_length;
          local_60.View_._M_str = local_b0._M_dataplus._M_p;
          cmStrCat<>(&local_90,&local_118,&local_60);
          std::__cxx11::string::~string((string *)&local_b0);
          s = cmGeneratorTarget::GetProperty(context->CurrentTarget,&local_90);
          if (s.Value != (string *)0x0) {
            cmsys::SystemTools::UpperCase((string *)&local_118,s.Value);
            arg._M_str = (char *)local_118.View_._M_len;
            arg._M_len = (size_t)local_118.View_._M_str;
            cmExpandList(arg,&local_e8,false);
            std::__cxx11::string::~string((string *)&local_118);
            pbVar4 = (parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pbVar1 = (parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            while (pbVar4 != pbVar1) {
              cmsys::SystemTools::UpperCase((string *)&local_118,pbVar4);
              bVar2 = ::cm::
                      contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (&local_e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              pbVar4 = pbVar4 + 1;
              if (bVar2) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,"1",(allocator<char> *)&local_118);
                std::__cxx11::string::~string((string *)&local_90);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_e8);
                std::__cxx11::string::~string((string *)&local_d0);
                return __return_storage_ptr__;
              }
            }
          }
          std::__cxx11::string::~string((string *)&local_90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_e8);
        }
        std::__cxx11::string::~string((string *)&local_d0);
      }
      __s = "0";
LAB_0047101c:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_118);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&local_118,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Expression syntax not recognized.",
                 (allocator<char> *)&local_d0);
      reportError(context,(string *)&local_118,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_118);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (parameters.empty()) {
      return configurationNode.Evaluate(parameters, context, content, nullptr);
    }
    static cmsys::RegularExpression configValidator("^[A-Za-z0-9_]*$");
    if (!configValidator.find(parameters.front())) {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
    }
    context->HadContextSensitiveCondition = true;
    for (auto const& param : parameters) {
      if (context->Config.empty()) {
        if (param.empty()) {
          return "1";
        }
      } else if (cmsysString_strcasecmp(param.c_str(),
                                        context->Config.c_str()) == 0) {
        return "1";
      }
    }

    if (context->CurrentTarget && context->CurrentTarget->IsImported()) {
      cmValue loc = nullptr;
      cmValue imp = nullptr;
      std::string suffix;
      if (context->CurrentTarget->Target->GetMappedConfig(context->Config, loc,
                                                          imp, suffix)) {
        // This imported target has an appropriate location
        // for this (possibly mapped) config.
        // Check if there is a proper config mapping for the tested config.
        std::vector<std::string> mappedConfigs;
        std::string mapProp = cmStrCat(
          "MAP_IMPORTED_CONFIG_", cmSystemTools::UpperCase(context->Config));
        if (cmValue mapValue = context->CurrentTarget->GetProperty(mapProp)) {
          cmExpandList(cmSystemTools::UpperCase(*mapValue), mappedConfigs);

          for (auto const& param : parameters) {
            if (cm::contains(mappedConfigs, cmSystemTools::UpperCase(param))) {
              return "1";
            }
          }
        }
      }
    }
    return "0";
  }